

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.h
# Opt level: O0

void __thiscall FIX::Header::Header(Header *this)

{
  message_order local_30;
  Header *local_10;
  Header *this_local;
  
  local_10 = this;
  message_order::message_order(&local_30,header);
  FieldMap::FieldMap(&this->super_FieldMap,&local_30,8);
  message_order::~message_order(&local_30);
  (this->super_FieldMap)._vptr_FieldMap = (_func_int **)&PTR__Header_00330298;
  return;
}

Assistant:

Header()
      : FieldMap(message_order(message_order::header), REQUIRED_FIELDS) {}